

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O3

void BrotliEncoderSetCustomDictionary(BrotliEncoderState *s,size_t size,uint8_t *dict)

{
  ushort uVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  uint32_t *puVar4;
  H54 *__s;
  H2 *__s_00;
  H4 *__s_01;
  H42 *__s_02;
  H6 *__s_03;
  H3 *__s_04;
  H5 *__s_05;
  H9 *__s_06;
  H7 *__s_07;
  H8 *__s_08;
  uint uVar5;
  int iVar6;
  uint uVar7;
  char cVar8;
  uint8_t *puVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  uint8_t *input_buffer;
  uint8_t *__s2;
  size_t input_size;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  H40 *__s_09;
  bool bVar23;
  H10 *self;
  ulong local_80;
  ulong local_78;
  uint8_t *local_60;
  
  iVar6 = (s->params).lgwin;
  EnsureInitialized(s);
  if (size == 0) {
    return;
  }
  if ((uint)(s->params).quality < 2) {
    return;
  }
  uVar11 = (1L << ((byte)iVar6 & 0x3f)) - 0x10;
  input_size = size;
  if (uVar11 < size) {
    input_size = uVar11;
  }
  lVar20 = 0;
  if (uVar11 <= size) {
    lVar20 = size - uVar11;
  }
  input_buffer = dict + lVar20;
  CopyInputToRingBuffer(s,input_size,input_buffer);
  s->last_flush_pos_ = input_size;
  s->last_processed_pos_ = input_size;
  if ((uVar11 != 0) && (s->prev_byte_ = input_buffer[input_size - 1], 1 < input_size)) {
    s->prev_byte2_ = input_buffer[input_size - 2];
  }
  uVar5 = (s->params).quality;
  if (9 < (int)uVar5) {
    self = (s->hashers_).h10;
    InitH10(&s->memory_manager_,self,(uint8_t *)s,(BrotliEncoderParams *)0x0,input_size,0,(int)self)
    ;
    if (input_size < 0x80) {
      return;
    }
    uVar11 = self->window_mask_;
    uVar17 = 0;
    local_60 = input_buffer;
    while( true ) {
      uVar5 = (uint)(*(int *)(input_buffer + uVar17) * 0x1e35a7bd) >> 0xf;
      uVar21 = (ulong)self->buckets_[uVar5];
      local_78 = (uVar11 & uVar17) * 2 + 1;
      local_80 = (uVar11 & uVar17) * 2;
      self->buckets_[uVar5] = (uint32_t)uVar17;
      if (uVar17 != uVar21) break;
LAB_0012bff7:
      uVar3 = self->invalid_pos_;
      puVar4 = self->forest_;
      puVar4[local_80] = uVar3;
      puVar4[local_78] = uVar3;
LAB_0012c018:
      local_60 = local_60 + 1;
      bVar23 = uVar17 == input_size - 0x80;
      uVar17 = uVar17 + 1;
      if (bVar23) {
        return;
      }
    }
    lVar20 = 0x40;
    uVar12 = 0;
    uVar13 = 0;
LAB_0012c049:
    bVar23 = lVar20 != 0;
    lVar20 = lVar20 + -1;
    if ((uVar17 - uVar21 <= uVar11 - 0xf) && (bVar23)) {
      uVar22 = uVar12;
      if (uVar13 < uVar12) {
        uVar22 = uVar13;
      }
      if (0x80 < uVar22) {
        __assert_fail("cur_len <= MAX_TREE_COMP_LENGTH",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./././hash_to_binary_tree_inc.h"
                      ,0x9d,
                      "BackwardMatch *StoreAndFindMatchesH10(H10 *, const uint8_t *const restrict, const size_t, const size_t, const size_t, const size_t, size_t *const restrict, BackwardMatch *restrict)"
                     );
      }
      __s2 = input_buffer + uVar21;
      puVar9 = __s2 + uVar22;
      uVar10 = 0x80 - uVar22;
      if (uVar22 < 0x79) {
        uVar19 = uVar10 >> 3 & 0x1fffffff;
        uVar14 = (ulong)((uint)uVar10 & 0xfffffff8);
        lVar15 = 0;
LAB_0012c0af:
        if (*(ulong *)(puVar9 + lVar15) == *(ulong *)(local_60 + lVar15 + uVar22))
        goto code_r0x0012c0bc;
        uVar14 = *(ulong *)(local_60 + lVar15 + uVar22) ^ *(ulong *)(puVar9 + lVar15);
        uVar10 = 0;
        if (uVar14 != 0) {
          for (; (uVar14 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
          }
        }
        uVar19 = (uVar10 >> 3 & 0x1fffffff) + lVar15;
        goto LAB_0012c0da;
      }
      uVar14 = 0;
      goto LAB_0012c17d;
    }
    goto LAB_0012bff7;
  }
  if (uVar5 == 4) {
    if (0xfffff < (s->params).size_hint) {
      __s = (s->hashers_).h54;
      if (__s->is_dirty_ != 0) {
        memset(__s,0,0x400014);
      }
      if (input_size < 8) {
        return;
      }
      uVar11 = 0;
      do {
        __s->buckets_
        [(uint)((ulong)(*(long *)(input_buffer + uVar11) * 0x35a7bd1e35a7bd00) >> 0x2c) +
         ((uint)(uVar11 >> 3) & 3)] = (uint32_t)uVar11;
        uVar11 = uVar11 + 1;
      } while (input_size - 7 != uVar11);
      return;
    }
switchD_0012c388_caseD_4:
    __s_01 = (s->hashers_).h4;
    if (__s_01->is_dirty_ != 0) {
      memset(__s_01,0,0x80014);
    }
    if (input_size < 8) {
      return;
    }
    uVar11 = 0;
    do {
      __s_01->buckets_
      [(uint)((ulong)(*(long *)(input_buffer + uVar11) * -0x42e1ca5843000000) >> 0x2f) +
       ((uint)(uVar11 >> 3) & 3)] = (uint32_t)uVar11;
      uVar11 = uVar11 + 1;
    } while (input_size - 7 != uVar11);
    return;
  }
  cVar8 = (char)uVar5;
  uVar7 = uVar5;
  if ((((int)uVar5 < 5) || (0x10 < (s->params).lgwin)) || (uVar7 = 0x2a - (uVar5 < 9), 6 < uVar5)) {
    switch(uVar7) {
    case 2:
      __s_00 = (s->hashers_).h2;
      if (__s_00->is_dirty_ != 0) {
        memset(__s_00,0,0x40008);
      }
      if (7 < input_size) {
        lVar20 = 0;
        do {
          __s_00->buckets_[(ulong)(*(long *)(input_buffer + lVar20) * -0x42e1ca5843000000) >> 0x30]
               = (uint32_t)lVar20;
          lVar20 = lVar20 + 1;
        } while (input_size - 7 != lVar20);
      }
      break;
    case 3:
      __s_04 = (s->hashers_).h3;
      if (__s_04->is_dirty_ != 0) {
        memset(__s_04,0,0x4000c);
      }
      if (7 < input_size) {
        lVar20 = 0;
        do {
          *(uint *)((long)__s_04->buckets_ +
                   (ulong)(((uint)(ushort)((ulong)(*(long *)(input_buffer + lVar20) *
                                                  -0x42e1ca5843000000) >> 0x30) +
                           (uint)(((uint)lVar20 >> 3 & 1) != 0)) * 4)) = (uint)lVar20;
          lVar20 = lVar20 + 1;
        } while (input_size - 7 != lVar20);
      }
      break;
    case 4:
      goto switchD_0012c388_caseD_4;
    case 5:
      __s_05 = (s->hashers_).h5;
      if (__s_05->is_dirty_ != 0) {
        memset(__s_05,0,0x8000);
        __s_05->is_dirty_ = 0;
      }
      if (3 < input_size) {
        lVar20 = 0;
        do {
          uVar5 = (uint)(*(int *)(input_buffer + lVar20) * 0x1e35a7bd) >> 0x12;
          uVar1 = __s_05->num_[uVar5];
          *(int *)((long)__s_05->buckets_ + (ulong)(uVar5 * 0x40 + (uVar1 & 0xf) * 4)) = (int)lVar20
          ;
          __s_05->num_[uVar5] = uVar1 + 1;
          lVar20 = lVar20 + 1;
        } while (input_size - 3 != lVar20);
      }
      break;
    case 6:
      __s_03 = (s->hashers_).h6;
      if (__s_03->is_dirty_ != 0) {
        memset(__s_03,0,0x8000);
        __s_03->is_dirty_ = 0;
      }
      if (3 < input_size) {
        lVar20 = 0;
        do {
          uVar5 = (uint)(*(int *)(input_buffer + lVar20) * 0x1e35a7bd) >> 0x12;
          uVar1 = __s_03->num_[uVar5];
          *(int *)((long)__s_03->buckets_ + (ulong)(uVar5 * 0x80 + (uVar1 & 0x1f) * 4)) =
               (int)lVar20;
          __s_03->num_[uVar5] = uVar1 + 1;
          lVar20 = lVar20 + 1;
        } while (input_size - 3 != lVar20);
      }
      break;
    case 7:
      __s_07 = (s->hashers_).h7;
      if (__s_07->is_dirty_ != 0) {
        memset(__s_07,0,0x10000);
        __s_07->is_dirty_ = 0;
      }
      if (3 < input_size) {
        lVar20 = 0;
        do {
          uVar5 = (uint)(*(int *)(input_buffer + lVar20) * 0x1e35a7bd) >> 0x11;
          uVar1 = __s_07->num_[uVar5];
          *(int *)((long)__s_07->buckets_ + (ulong)(uVar5 * 0x100 + (uVar1 & 0x3f) * 4)) =
               (int)lVar20;
          __s_07->num_[uVar5] = uVar1 + 1;
          lVar20 = lVar20 + 1;
        } while (input_size - 3 != lVar20);
      }
      break;
    case 8:
      __s_08 = (s->hashers_).h8;
      if (__s_08->is_dirty_ != 0) {
        memset(__s_08,0,0x10000);
        __s_08->is_dirty_ = 0;
      }
      if (3 < input_size) {
        lVar20 = 0;
        do {
          uVar5 = (uint)(*(int *)(input_buffer + lVar20) * 0x1e35a7bd) >> 0x11;
          uVar1 = __s_08->num_[uVar5];
          *(int *)((long)__s_08->buckets_ + (ulong)(uVar5 * 0x200 + (uVar1 & 0x7f) * 4)) =
               (int)lVar20;
          __s_08->num_[uVar5] = uVar1 + 1;
          lVar20 = lVar20 + 1;
        } while (input_size - 3 != lVar20);
      }
      break;
    case 9:
      __s_06 = (s->hashers_).h9;
      if (__s_06->is_dirty_ != 0) {
        memset(__s_06,0,0x10000);
        __s_06->is_dirty_ = 0;
      }
      if (3 < input_size) {
        lVar20 = 0;
        do {
          uVar5 = (uint)(*(int *)(input_buffer + lVar20) * 0x1e35a7bd) >> 0x11;
          uVar2 = __s_06->num_[uVar5];
          *(int *)((long)__s_06->buckets_ + (ulong)(uVar5 * 0x400 + (uint)(byte)uVar2 * 4)) =
               (int)lVar20;
          __s_06->num_[uVar5] = uVar2 + 1;
          lVar20 = lVar20 + 1;
        } while (input_size - 3 != lVar20);
      }
      break;
    default:
      if (uVar7 != 0x29) {
        if (uVar7 != 0x2a) {
          return;
        }
        __s_02 = (s->hashers_).h42;
        __s_02->max_hops = (ulong)(((int)uVar5 < 7) + 7 << (cVar8 - 4U & 0x1f));
        if (__s_02->is_dirty_ != 0) {
          memset(__s_02,0xcc,0x20000);
          memset(__s_02->head,0,0x20000);
          memset(__s_02->free_slot_idx,0,0x404);
        }
        if (input_size < 4) {
          return;
        }
        uVar11 = 0;
        do {
          uVar5 = (uint)(*(int *)(input_buffer + uVar11) * 0x1e35a7bd) >> 0x11;
          uVar18 = uVar5 & 0x1ff;
          uVar1 = __s_02->free_slot_idx[uVar18];
          __s_02->free_slot_idx[uVar18] = uVar1 + 1;
          uVar7 = uVar1 & 0x1ff;
          uVar17 = uVar11 - __s_02->addr[uVar5];
          __s_02->tiny_hash[uVar11 & 0xffff] = (uint8_t)uVar5;
          if (0xfffe < uVar17) {
            uVar17 = 0xffff;
          }
          *(short *)((long)&__s_02->banks[0].slots[uVar7].delta + (ulong)(uVar18 << 0xb)) =
               (short)uVar17;
          *(uint16_t *)((long)&__s_02->banks[0].slots[uVar7].next + (ulong)(uVar18 << 0xb)) =
               __s_02->head[uVar5];
          __s_02->addr[uVar5] = (uint32_t)uVar11;
          __s_02->head[uVar5] = (uint16_t)uVar7;
          uVar11 = uVar11 + 1;
        } while (input_size - 3 != uVar11);
        return;
      }
      __s_09 = (H40 *)(s->hashers_).h41;
      __s_09->max_hops = (ulong)(((int)uVar5 < 7) + 7 << (cVar8 - 4U & 0x1f));
      if (__s_09->is_dirty_ != 0) {
        memset(__s_09,0xcc,0x20000);
        __s_09->free_slot_idx[0] = 0;
        __s_09->is_dirty_ = 0;
        memset(__s_09->head,0,0x20000);
      }
      if (input_size < 4) {
        return;
      }
      uVar1 = __s_09->free_slot_idx[0];
      uVar11 = 0;
      do {
        uVar5 = (uint)(*(int *)(input_buffer + uVar11) * 0x1e35a7bd) >> 0x11;
        uVar17 = uVar11 - __s_09->addr[uVar5];
        __s_09->tiny_hash[uVar11 & 0xffff] = (uint8_t)uVar5;
        if (0xfffe < uVar17) {
          uVar17 = 0xffff;
        }
        uVar7 = (uint)uVar1 + (uint32_t)uVar11;
        uVar18 = uVar7 & 0xffff;
        __s_09->banks[0].slots[uVar18].delta = (uint16_t)uVar17;
        __s_09->banks[0].slots[uVar18].next = __s_09->head[uVar5];
        __s_09->addr[uVar5] = (uint32_t)uVar11;
        __s_09->head[uVar5] = (uint16_t)uVar7;
        uVar11 = uVar11 + 1;
      } while (input_size - 3 != uVar11);
      goto LAB_0012c643;
    }
  }
  else {
    __s_09 = (s->hashers_).h40;
    __s_09->max_hops = (ulong)(uint)(8 << (cVar8 - 4U & 0x1f));
    if (__s_09->is_dirty_ != 0) {
      memset(__s_09,0xcc,0x20000);
      __s_09->free_slot_idx[0] = 0;
      __s_09->is_dirty_ = 0;
      memset(__s_09->head,0,0x20000);
    }
    if (input_size < 4) {
      return;
    }
    uVar1 = __s_09->free_slot_idx[0];
    uVar11 = 0;
    do {
      uVar5 = (uint)(*(int *)(input_buffer + uVar11) * 0x1e35a7bd) >> 0x11;
      uVar17 = uVar11 - __s_09->addr[uVar5];
      __s_09->tiny_hash[uVar11 & 0xffff] = (uint8_t)uVar5;
      if (0xfffe < uVar17) {
        uVar17 = 0xffff;
      }
      uVar7 = (uint)uVar1 + (uint32_t)uVar11;
      uVar18 = uVar7 & 0xffff;
      __s_09->banks[0].slots[uVar18].delta = (uint16_t)uVar17;
      __s_09->banks[0].slots[uVar18].next = __s_09->head[uVar5];
      __s_09->addr[uVar5] = (uint32_t)uVar11;
      __s_09->head[uVar5] = (uint16_t)uVar7;
      uVar11 = uVar11 + 1;
    } while (input_size - 3 != uVar11);
LAB_0012c643:
    __s_09->free_slot_idx[0] = uVar1 + (short)uVar11;
  }
  return;
code_r0x0012c0bc:
  lVar15 = lVar15 + 8;
  uVar19 = uVar19 - 1;
  if (uVar19 == 0) goto code_r0x0012c0c5;
  goto LAB_0012c0af;
code_r0x0012c0c5:
  puVar9 = puVar9 + lVar15;
LAB_0012c17d:
  uVar10 = uVar10 & 7;
  uVar19 = uVar14;
  if (uVar10 != 0) {
    uVar16 = uVar14 | uVar10;
    do {
      uVar19 = uVar14;
      if (local_60[uVar14 + uVar22] != *puVar9) break;
      puVar9 = puVar9 + 1;
      uVar14 = uVar14 + 1;
      uVar10 = uVar10 - 1;
      uVar19 = uVar16;
    } while (uVar10 != 0);
  }
LAB_0012c0da:
  uVar19 = uVar19 + uVar22;
  iVar6 = bcmp(input_buffer + uVar17,__s2,uVar19);
  if (iVar6 != 0) {
    __assert_fail("0 == memcmp(&data[cur_ix_masked], &data[prev_ix_masked], len)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./././hash_to_binary_tree_inc.h"
                  ,0xa2,
                  "BackwardMatch *StoreAndFindMatchesH10(H10 *, const uint8_t *const restrict, const size_t, const size_t, const size_t, const size_t, size_t *const restrict, BackwardMatch *restrict)"
                 );
  }
  if (0x7f < uVar19) {
    puVar4 = self->forest_;
    puVar4[local_80] = puVar4[(uVar21 & uVar11) * 2];
    puVar4[local_78] = puVar4[(uVar21 & uVar11) * 2 + 1];
    goto LAB_0012c018;
  }
  uVar22 = (uVar21 & uVar11) * 2;
  puVar4 = self->forest_;
  if (__s2[uVar19] < (input_buffer + uVar17)[uVar19]) {
    puVar4[local_80] = (uint32_t)uVar21;
    uVar22 = uVar22 | 1;
    uVar13 = uVar19;
    local_80 = uVar22;
  }
  else {
    puVar4[local_78] = (uint32_t)uVar21;
    uVar12 = uVar19;
    local_78 = uVar22;
  }
  uVar21 = (ulong)puVar4[uVar22];
  if (uVar17 == uVar21) goto LAB_0012bff7;
  goto LAB_0012c049;
}

Assistant:

void BrotliEncoderSetCustomDictionary(BrotliEncoderState* s, size_t size,
                                      const uint8_t* dict) {
  size_t max_dict_size = BROTLI_MAX_BACKWARD_LIMIT(s->params.lgwin);
  size_t dict_size = size;
  MemoryManager* m = &s->memory_manager_;

  if (!EnsureInitialized(s)) return;

  if (dict_size == 0 ||
      s->params.quality == FAST_ONE_PASS_COMPRESSION_QUALITY ||
      s->params.quality == FAST_TWO_PASS_COMPRESSION_QUALITY) {
    return;
  }
  if (size > max_dict_size) {
    dict += size - max_dict_size;
    dict_size = max_dict_size;
  }
  CopyInputToRingBuffer(s, dict_size, dict);
  s->last_flush_pos_ = dict_size;
  s->last_processed_pos_ = dict_size;
  if (dict_size > 0) {
    s->prev_byte_ = dict[dict_size - 1];
  }
  if (dict_size > 1) {
    s->prev_byte2_ = dict[dict_size - 2];
  }
  HashersPrependCustomDictionary(m, &s->hashers_, &s->params, dict_size, dict);
  if (BROTLI_IS_OOM(m)) return;
}